

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.hpp
# Opt level: O1

void __thiscall OpenMD::OpenMDBitSet::OpenMDBitSet(OpenMDBitSet *this,size_t nbits)

{
  ulong in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->bitset_,nbits,(bool *)((long)&uStack_18 + 7),
             (allocator_type *)((long)&uStack_18 + 6));
  setBits(this,0,(ulong)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                 ((long)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                 (long)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8,false);
  return;
}

Assistant:

OpenMDBitSet(size_t nbits) : bitset_(nbits) { clearAll(); }